

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int runtest(int i)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  undefined4 *puVar9;
  long lVar10;
  char *r1;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  uint uVar11;
  stat64 *__buf;
  uint uVar12;
  char *out;
  char *pcVar13;
  ulong uVar14;
  undefined8 unaff_R14;
  ulong uVar15;
  stat buf;
  int iStack_1ac;
  char *pcStack_1a8;
  char *pcStack_1a0;
  long lStack_198;
  long lStack_190;
  char *pcStack_188;
  testDesc *ptStack_180;
  code *pcStack_178;
  stat64 *psStack_170;
  ulong uStack_168;
  ulong uStack_160;
  testDesc *ptStack_158;
  code *pcStack_150;
  undefined1 local_139;
  long local_138;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  long local_120;
  long local_118;
  char *local_110;
  glob64_t local_108;
  stat64 local_c0;
  glob64_t *__pglob;
  
  iVar3 = nb_leaks;
  iVar2 = nb_errors;
  local_124 = nb_tests;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    pcStack_150 = (code *)0x108855;
    printf("## %s\n");
  }
  pcStack_150 = (code *)0x10886d;
  local_118 = xmlGetCharEncodingHandler(6);
  pcStack_150 = (code *)0x10887e;
  local_120 = xmlFindCharEncodingHandler("IBM-1141");
  pcStack_150 = (code *)0x10888d;
  lVar4 = xmlGetCharEncodingHandler(0x15);
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else {
    pcStack_150 = (code *)0x10889f;
    uVar5 = xmlBufferCreateSize(10);
    pcStack_150 = (code *)0x1088b1;
    xmlBufferCCat(uVar5,anon_var_dwarf_2491);
    pcStack_150 = (code *)0x1088bb;
    unaff_R14 = xmlBufferCreateSize(10);
    pcStack_150 = (code *)0x1088cc;
    iVar1 = xmlCharEncInFunc(lVar4,unaff_R14,uVar5);
    if (iVar1 != 3) {
      pcStack_150 = (code *)0x1088d9;
      xmlCharEncCloseFunc(lVar4);
      lVar4 = 0;
    }
    pcStack_150 = (code *)0x1088e4;
    xmlBufferFree(unaff_R14);
    pcStack_150 = (code *)0x1088ec;
    xmlBufferFree(uVar5);
  }
  if (testDescriptions[i].in == (char *)0x0) {
    testErrorsSize = 0;
    testErrors[0] = '\0';
    pcStack_150 = (code *)0x108b82;
    iVar1 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    pcStack_150 = (code *)0x108b89;
    xmlResetLastError();
    if (iVar1 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_12c = iVar3;
    local_128 = iVar2;
    __pglob = &local_108;
    local_108.gl_offs = 0;
    pcStack_150 = (code *)0x108923;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,__pglob);
    if (local_108.gl_pathc != 0) {
      local_139 = local_120 == 0 || local_118 == 0;
      uVar15 = CONCAT71((int7)((ulong)unaff_R14 >> 8),local_139);
      local_130 = 0;
      uVar14 = 0;
      local_138 = lVar4;
      do {
        __buf = &local_c0;
        pcStack_150 = (code *)0x108976;
        iVar2 = stat64(local_108.gl_pathv[uVar14],__buf);
        if ((iVar2 != -1) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
          if ((char)uVar15 != '\0') {
            pcStack_150 = (code *)0x1089ad;
            pcVar6 = strstr(local_108.gl_pathv[uVar14],"ebcdic");
            if (pcVar6 != (char *)0x0) goto LAB_00108ab8;
          }
          uVar11 = (uint)__pglob;
          if (lVar4 == 0) {
            pcStack_150 = (code *)0x1089f8;
            pcVar6 = strstr(local_108.gl_pathv[uVar14],"icu_parse_test");
            uVar11 = (uint)__pglob;
            if (pcVar6 != (char *)0x0) goto LAB_00108ab8;
          }
          if (testDescriptions[i].suffix == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar13 = local_108.gl_pathv[uVar14];
            out = testDescriptions[i].out;
            pcStack_150 = (code *)0x1089d6;
            pcVar6 = resultFilename(pcVar13,out,testDescriptions[i].suffix);
            if (pcVar6 == (char *)0x0) {
              pcStack_150 = (code *)0x108c15;
              runtest_cold_1();
              goto LAB_00108c15;
            }
          }
          if (testDescriptions[i].err == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar13 = local_108.gl_pathv[uVar14];
            out = testDescriptions[i].out;
            pcStack_150 = (code *)0x108a20;
            pcVar7 = resultFilename(pcVar13,out,testDescriptions[i].err);
            if (pcVar7 == (char *)0x0) {
              __buf = (stat64 *)0x0;
LAB_00108c15:
              pcStack_150 = oldParseTest;
              runtest_cold_2();
              nb_tests = nb_tests + 1;
              pcStack_178 = (code *)0x108c33;
              psStack_170 = __buf;
              uStack_168 = uVar14;
              uStack_160 = uVar15;
              ptStack_158 = testDescriptions + i;
              pcStack_150 = (code *)pcVar6;
              puVar9 = (undefined4 *)__xmlGetWarningsDefaultValue();
              *puVar9 = 0;
              pcStack_178 = (code *)0x108c41;
              lVar10 = xmlParseFile(pcVar13);
              pcStack_178 = (code *)0x108c49;
              puVar9 = (undefined4 *)__xmlGetWarningsDefaultValue();
              *puVar9 = 1;
              uVar12 = 1;
              if (lVar10 != 0) {
                pcStack_178 = (code *)0x108c73;
                pcVar6 = temp_directory;
                pcVar7 = pcVar13;
                r1 = resultFilename(pcVar13,temp_directory,".res");
                if (r1 == (char *)0x0) {
                  pcStack_178 = memParseTest;
                  oldParseTest_cold_1();
                  pcStack_178 = (code *)0x1;
                  nb_tests = nb_tests + 1;
                  pcStack_1a0 = out;
                  lStack_198 = lVar10;
                  lStack_190 = lVar4;
                  pcStack_188 = pcVar13;
                  ptStack_180 = testDescriptions + i;
                  iVar2 = loadMem(pcVar7,&pcStack_1a8,&iStack_1ac);
                  if (iVar2 == 0) {
                    ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
                    pcVar13 = pcStack_1a8;
                    doc = (xmlDocPtr)
                          xmlCtxtReadMemory(ctxt,pcStack_1a8,iStack_1ac,pcVar7,0,uVar11 | 0x40);
                    free(pcVar13);
                    if (doc == (xmlDocPtr)0x0) {
                      iVar2 = 1;
                    }
                    else {
                      xmlDocDumpMemory(doc,&pcStack_1a8,&iStack_1ac);
                      iVar2 = compareFileMem(pcVar6,pcStack_1a8,iStack_1ac);
                      iVar3 = 0;
                      if ((pcStack_1a8 == (char *)0x0) || (iVar2 != 0)) {
                        fprintf(_stderr,"Result for %s failed in %s\n",pcVar7,pcVar6);
                        iVar3 = -1;
                      }
                      iVar1 = testParseContent(ctxt,doc,pcVar7);
                      iVar2 = -1;
                      if (-1 < iVar1) {
                        iVar2 = iVar3;
                      }
                      xmlFreeDoc(doc);
                      xmlFreeParserCtxt(ctxt);
                      (*_xmlFree)(pcStack_1a8);
                    }
                  }
                  else {
                    fprintf(_stderr,"Failed to load %s\n",pcVar7);
                    iVar2 = -1;
                  }
                  return iVar2;
                }
                pcStack_178 = (code *)0x108c8a;
                xmlSaveFile(r1,lVar10);
                pcStack_178 = (code *)0x108c95;
                iVar2 = compareFiles(r1,out);
                pcStack_178 = (code *)0x108ca0;
                xmlFreeDoc(lVar10);
                pcStack_178 = (code *)0x108ca5;
                puVar9 = (undefined4 *)__xmlGetWarningsDefaultValue();
                *puVar9 = 0;
                pcStack_178 = (code *)0x108cb3;
                lVar4 = xmlParseFile(r1);
                pcStack_178 = (code *)0x108cbb;
                puVar9 = (undefined4 *)__xmlGetWarningsDefaultValue();
                *puVar9 = 1;
                if (lVar4 != 0) {
                  pcStack_178 = (code *)0x108cd1;
                  xmlSaveFile(r1,lVar4);
                  pcStack_178 = (code *)0x108cdc;
                  iVar3 = compareFiles(r1,out);
                  uVar12 = (uint)(iVar3 != 0 || iVar2 != 0);
                  pcStack_178 = (code *)0x108ced;
                  xmlFreeDoc(lVar4);
                  pcStack_178 = (code *)0x108cf5;
                  unlink(r1);
                  pcStack_178 = (code *)0x108cfd;
                  free(r1);
                }
              }
              return uVar12;
            }
          }
          pcStack_150 = (code *)0x108a34;
          iVar2 = xmlMemUsed();
          testErrorsSize = 0;
          testErrors[0] = '\0';
          uVar11 = testDescriptions[i].options | 0x10000;
          __pglob = (glob64_t *)(ulong)uVar11;
          pcStack_150 = (code *)0x108a66;
          iVar3 = (*testDescriptions[i].func)(local_108.gl_pathv[uVar14],pcVar6,pcVar7,uVar11);
          pcStack_150 = (code *)0x108a6e;
          xmlResetLastError();
          if (iVar3 == 0) {
            pcStack_150 = (code *)0x108a78;
            iVar3 = xmlMemUsed();
            __stream = _stderr;
            lVar4 = local_138;
            if (iVar3 != iVar2) {
              local_110 = local_108.gl_pathv[uVar14];
              pcStack_150 = (code *)0x108b17;
              iVar3 = xmlMemUsed();
              lVar4 = local_138;
              __pglob = (glob64_t *)(ulong)(uint)(iVar3 - iVar2);
              pcStack_150 = (code *)0x108b37;
              fprintf(__stream,"File %s leaked %d bytes\n",local_110,__pglob);
              piVar8 = &nb_leaks;
              goto LAB_00108b3e;
            }
          }
          else {
            pcStack_150 = (code *)0x108aec;
            fprintf(_stderr,"File %s generated an error\n",local_108.gl_pathv[uVar14]);
            piVar8 = &nb_errors;
            lVar4 = local_138;
LAB_00108b3e:
            *piVar8 = *piVar8 + 1;
            local_130 = local_130 + 1;
          }
          uVar15 = (ulong)CONCAT31((int3)((uint)iVar2 >> 8),local_139);
          testErrorsSize = 0;
          if (pcVar6 != (char *)0x0) {
            pcStack_150 = (code *)0x108a9e;
            free(pcVar6);
          }
          if (pcVar7 != (char *)0x0) {
            pcStack_150 = (code *)0x108aab;
            free(pcVar7);
          }
        }
LAB_00108ab8:
        uVar14 = uVar14 + 1;
      } while (uVar14 < local_108.gl_pathc);
    }
    pcStack_150 = (code *)0x108b58;
    globfree64(&local_108);
    iVar2 = local_128;
    iVar3 = local_12c;
  }
  pcStack_150 = (code *)0x108b9d;
  xmlCharEncCloseFunc(local_118);
  pcStack_150 = (code *)0x108ba7;
  xmlCharEncCloseFunc(local_120);
  pcStack_150 = (code *)0x108baf;
  iVar1 = xmlCharEncCloseFunc(lVar4);
  if (verbose == '\x01') {
    if (nb_leaks == iVar3 && nb_errors == iVar2) {
      pcStack_150 = (code *)0x108be9;
      iVar1 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - local_124));
    }
    else {
      pcStack_150 = (code *)0x108bfe;
      iVar1 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - local_124),
                     (ulong)(uint)(nb_errors - iVar2),(ulong)(uint)(nb_leaks - iVar3));
    }
  }
  return iVar1;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}